

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::unregister(CoreBroker *this)

{
  char *pcVar1;
  string_view name;
  string_view name_00;
  char *unaff_RBX;
  string_view brokerName;
  string_view brokerName_00;
  shared_ptr<helics::Broker> keepBrokerAlive2;
  shared_ptr<helics::Broker> keepBrokerAlive;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  long local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffe8;
  
  brokerName._M_str = (char *)(this->super_BrokerBase).identifier._M_string_length;
  brokerName._M_len = (size_t)&local_20;
  BrokerFactory::findBroker(brokerName);
  if (local_20 != 0) {
    name._M_str = unaff_RBX;
    name._M_len = (size_t)in_stack_ffffffffffffffe8;
    BrokerFactory::unregisterBroker(name);
  }
  pcVar1 = (char *)(this->mPreviousLocalBrokerIdentifier)._M_string_length;
  if (pcVar1 != (char *)0x0) {
    brokerName_00._M_str = pcVar1;
    brokerName_00._M_len = (size_t)&local_30;
    BrokerFactory::findBroker(brokerName_00);
    if (local_30 != 0) {
      name_00._M_str = unaff_RBX;
      name_00._M_len = (size_t)in_stack_ffffffffffffffe8;
      BrokerFactory::unregisterBroker(name_00);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  if (in_stack_ffffffffffffffe8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void CoreBroker::unregister()
{
    /*We need to ensure that the destructor is not called immediately upon calling unregister
    otherwise this would be a mess and probably cause segmentation faults so we capture it in a
    local variable that will be destroyed on function exit
    */
    auto keepBrokerAlive = BrokerFactory::findBroker(identifier);
    if (keepBrokerAlive) {
        BrokerFactory::unregisterBroker(identifier);
    }
    if (!mPreviousLocalBrokerIdentifier.empty()) {
        auto keepBrokerAlive2 = BrokerFactory::findBroker(mPreviousLocalBrokerIdentifier);
        if (keepBrokerAlive2) {
            BrokerFactory::unregisterBroker(mPreviousLocalBrokerIdentifier);
        }
    }
}